

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Barcode.cpp
# Opt level: O1

void __thiscall
ZXing::Result::Result
          (Result *this,DecoderResult *decodeResult,DetectorResult *detectorResult,
          BarcodeFormat format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  pointer puVar11;
  pointer pEVar12;
  undefined8 uVar13;
  bool bVar14;
  
  puVar11 = (decodeResult->_content).bytes.
            super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish;
  (this->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (decodeResult->_content).bytes.
             super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar11;
  (this->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (decodeResult->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (decodeResult->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (decodeResult->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (decodeResult->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pEVar12 = (decodeResult->_content).encodings.
            super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  (this->_content).encodings.
  super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
  super__Vector_impl_data._M_start =
       (decodeResult->_content).encodings.
       super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->_content).encodings.
  super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
  super__Vector_impl_data._M_finish = pEVar12;
  (this->_content).encodings.
  super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (decodeResult->_content).encodings.
       super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (decodeResult->_content).encodings.
  super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (decodeResult->_content).encodings.
  super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (decodeResult->_content).encodings.
  super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar14 = (decodeResult->_content).hasECI;
  (this->_content).defaultCharset = (decodeResult->_content).defaultCharset;
  (this->_content).hasECI = bVar14;
  (this->_content).symbology = (decodeResult->_content).symbology;
  paVar1 = &(this->_error)._msg.field_2;
  (this->_error)._msg._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (decodeResult->_error)._msg._M_dataplus._M_p;
  paVar2 = &(decodeResult->_error)._msg.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar13 = *(undefined8 *)((long)&(decodeResult->_error)._msg.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->_error)._msg.field_2 + 8) = uVar13;
  }
  else {
    (this->_error)._msg._M_dataplus._M_p = pcVar3;
    (this->_error)._msg.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->_error)._msg._M_string_length = (decodeResult->_error)._msg._M_string_length;
  (decodeResult->_error)._msg._M_dataplus._M_p = (pointer)paVar2;
  (decodeResult->_error)._msg._M_string_length = 0;
  (decodeResult->_error)._msg.field_2._M_local_buf[0] = '\0';
  *(undefined4 *)((long)&(this->_error)._file + 7) =
       *(undefined4 *)((long)&(decodeResult->_error)._file + 7);
  (this->_error)._file = (decodeResult->_error)._file;
  iVar4 = (detectorResult->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y;
  iVar5 = (detectorResult->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x;
  iVar6 = (detectorResult->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y;
  iVar7 = (detectorResult->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x;
  iVar8 = (detectorResult->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y;
  iVar9 = (detectorResult->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x;
  iVar10 = (detectorResult->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y;
  (this->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x =
       (detectorResult->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x;
  (this->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = iVar4;
  (this->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = iVar5;
  (this->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = iVar6;
  (this->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = iVar7;
  (this->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = iVar8;
  (this->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = iVar9;
  (this->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = iVar10;
  *(uint *)&this->_readerOpts = *(uint *)&this->_readerOpts & 0xc0e08000 | 0x80d2f;
  (this->_readerOpts)._minLineCount = '\x02';
  (this->_readerOpts)._maxNumberOfSymbols = 0xff;
  (this->_readerOpts)._downscaleThreshold = 500;
  (this->_readerOpts)._formats = 0;
  iVar4 = (decodeResult->_structuredAppend).count;
  (this->_sai).index = (decodeResult->_structuredAppend).index;
  (this->_sai).count = iVar4;
  (this->_sai).id._M_dataplus._M_p = (pointer)&(this->_sai).id.field_2;
  pcVar3 = (decodeResult->_structuredAppend).id._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->_sai).id,pcVar3,
             pcVar3 + (decodeResult->_structuredAppend).id._M_string_length);
  this->_format = format;
  this->_ecLevel[0] = '\0';
  this->_ecLevel[1] = '\0';
  this->_ecLevel[2] = '\0';
  this->_ecLevel[3] = '\0';
  this->_version[0] = '\0';
  this->_version[1] = '\0';
  this->_version[2] = '\0';
  this->_version[3] = '\0';
  this->_lineCount = decodeResult->_lineCount;
  this->_isMirrored = decodeResult->_isMirrored;
  this->_isInverted = false;
  this->_readerInit = decodeResult->_readerInit;
  if (decodeResult->_versionNumber != 0) {
    snprintf(this->_version,4,"%d");
  }
  snprintf(this->_ecLevel,4,"%s",(decodeResult->_ecLevel)._M_dataplus._M_p);
  return;
}

Assistant:

Result::Result(DecoderResult&& decodeResult, DetectorResult&& detectorResult, BarcodeFormat format)
	: _content(std::move(decodeResult).content()),
	  _error(std::move(decodeResult).error()),
	  _position(std::move(detectorResult).position()),
	  _sai(decodeResult.structuredAppend()),
	  _format(format),
	  _lineCount(decodeResult.lineCount()),
	  _isMirrored(decodeResult.isMirrored()),
	  _readerInit(decodeResult.readerInit())
#ifdef ZXING_EXPERIMENTAL_API
	  , _symbol(std::make_shared<BitMatrix>(std::move(detectorResult).bits()))
#endif
{
	if (decodeResult.versionNumber())
		snprintf(_version, 4, "%d", decodeResult.versionNumber());
	snprintf(_ecLevel, 4, "%s", decodeResult.ecLevel().data());

	// TODO: add type opaque and code specific 'extra data'? (see DecoderResult::extra())
}